

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

void data_sheet_expat_callback_find_cell_start(void *callbackdata,XML_Char *name,XML_Char **atts)

{
  int iVar1;
  XML_Char *pXVar2;
  size_t sVar3;
  size_t sVar4;
  ulong local_48;
  size_t cellmax;
  size_t cellrownr;
  size_t cellcolnr;
  XML_Char *t;
  data_sheet_callback_data *data;
  XML_Char **atts_local;
  XML_Char *name_local;
  void *callbackdata_local;
  
  iVar1 = XML_Char_icmp_ins(name,"c");
  if (iVar1 == 0) {
    pXVar2 = get_expat_attr_by_name(atts,"r");
    sVar3 = get_col_nr(pXVar2);
    if ((*(long *)((long)callbackdata + 0x18) == 0) && (sVar4 = get_row_nr(pXVar2), sVar4 != 0)) {
      if (((*(uint *)((long)callbackdata + 0x44) & 1) == 0) &&
         ((*(uint *)((long)callbackdata + 0x44) & 0x80) == 0)) {
        while (*(ulong *)((long)callbackdata + 0x10) < sVar4) {
          if (((*(uint *)((long)callbackdata + 0x44) & 2) == 0) &&
             (*(long *)((long)callbackdata + 0x78) != 0)) {
            while (*(ulong *)((long)callbackdata + 0x18) < *(ulong *)((long)callbackdata + 0x20)) {
              iVar1 = (**(code **)((long)callbackdata + 0x78))
                                (*(undefined8 *)((long)callbackdata + 0x10),
                                 *(long *)((long)callbackdata + 0x18) + 1,0,
                                 *(undefined8 *)((long)callbackdata + 0x80));
              if (iVar1 != 0) {
                XML_StopParser(*callbackdata,0);
                return;
              }
              *(long *)((long)callbackdata + 0x18) = *(long *)((long)callbackdata + 0x18) + 1;
            }
          }
          if ((*(long *)((long)callbackdata + 0x70) != 0) &&
             (iVar1 = (**(code **)((long)callbackdata + 0x70))
                                (*(undefined8 *)((long)callbackdata + 0x10),
                                 *(undefined8 *)((long)callbackdata + 0x20),
                                 *(undefined8 *)((long)callbackdata + 0x80)), iVar1 != 0)) {
            XML_StopParser(*callbackdata,0);
            return;
          }
          *(long *)((long)callbackdata + 0x10) = *(long *)((long)callbackdata + 0x10) + 1;
          *(undefined8 *)((long)callbackdata + 0x18) = 0;
        }
      }
      else {
        *(size_t *)((long)callbackdata + 0x10) = sVar4;
      }
    }
    if (sVar3 != 0) {
      local_48 = sVar3 - 1;
      if ((((*(uint *)((long)callbackdata + 0x44) & 2) == 0) &&
          (*(long *)((long)callbackdata + 0x18) != 0)) &&
         ((*(uint *)((long)callbackdata + 0x44) & 0x80) == 0)) {
        if ((((*(uint *)((long)callbackdata + 0x44) & 4) != 0) &&
            (*(long *)((long)callbackdata + 0x20) != 0)) &&
           (*(ulong *)((long)callbackdata + 0x20) < local_48)) {
          local_48 = *(ulong *)((long)callbackdata + 0x20);
        }
        while (*(ulong *)((long)callbackdata + 0x18) < local_48) {
          if (((*(long *)((long)callbackdata + 0x18) != 0) &&
              (*(long *)((long)callbackdata + 0x78) != 0)) &&
             (iVar1 = (**(code **)((long)callbackdata + 0x78))
                                (*(undefined8 *)((long)callbackdata + 0x10),
                                 *(long *)((long)callbackdata + 0x18) + 1,0,
                                 *(undefined8 *)((long)callbackdata + 0x80)), iVar1 != 0)) {
            XML_StopParser(*callbackdata,0);
            return;
          }
          *(long *)((long)callbackdata + 0x18) = *(long *)((long)callbackdata + 0x18) + 1;
        }
      }
      else {
        *(ulong *)((long)callbackdata + 0x18) = local_48;
      }
    }
    pXVar2 = get_expat_attr_by_name(atts,"t");
    if ((pXVar2 == (XML_Char *)0x0) || (iVar1 = strcasecmp(pXVar2,"s"), iVar1 != 0)) {
      *(undefined4 *)((long)callbackdata + 0x40) = 1;
    }
    else {
      *(undefined4 *)((long)callbackdata + 0x40) = 3;
    }
    free(*(void **)((long)callbackdata + 0x30));
    *(undefined8 *)((long)callbackdata + 0x30) = 0;
    *(undefined8 *)((long)callbackdata + 0x38) = 0;
    XML_SetElementHandler
              (*callbackdata,data_sheet_expat_callback_find_value_start,
               data_sheet_expat_callback_find_cell_end);
  }
  return;
}

Assistant:

void data_sheet_expat_callback_find_cell_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("c")) == 0) {
    const XML_Char* t = get_expat_attr_by_name(atts, X("r"));
    size_t cellcolnr = get_col_nr(t);
    //insert empty rows if needed
    if (data->colnr == 0) {
      size_t cellrownr = get_row_nr(t);
      if (cellrownr) {
        if (!(data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && !(data->flags & XLSXIOREAD_NO_CALLBACK)) {
          while (data->rownr < cellrownr) {
            //insert empty columns
            if (!(data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && data->sheet_cell_callback) {
              while (data->colnr < data->cols) {
                if ((*data->sheet_cell_callback)(data->rownr, data->colnr + 1, NULL, data->callbackdata)) {
                  XML_StopParser(data->xmlparser, XML_FALSE);
                  return;
                }
                data->colnr++;
              }
            }
            //finish empty row
            if (data->sheet_row_callback) {
              if ((*data->sheet_row_callback)(data->rownr, data->cols, data->callbackdata)) {
                XML_StopParser(data->xmlparser, XML_FALSE);
                return;
              }
            }
            data->rownr++;
            data->colnr = 0;
          }
        } else {
          data->rownr = cellrownr;
        }
      }
    }
    //insert empty columns if needed
    if (cellcolnr) {
      cellcolnr--;
      if ((data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) || data->colnr == 0 || (data->flags & XLSXIOREAD_NO_CALLBACK)) {
        data->colnr = cellcolnr;
      } else {
        size_t cellmax = cellcolnr;
        if ((data->flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && data->cols > 0 && cellmax > data->cols)
          cellmax = data->cols;
        while (data->colnr < cellmax) {
          if (data->colnr > 0 && data->sheet_cell_callback) {
            if ((*data->sheet_cell_callback)(data->rownr, data->colnr + 1, NULL, data->callbackdata)) {
              XML_StopParser(data->xmlparser, XML_FALSE);
              return;
            }
          }
          data->colnr++;
        }
      }
    }
    //determine value type
    if ((t = get_expat_attr_by_name(atts, X("t"))) != NULL && XML_Char_icmp(t, X("s")) == 0)
      data->cell_string_type = shared_string;
    else
      data->cell_string_type = value_string;
    //prepare empty value data
    free(data->celldata);
    data->celldata = NULL;
    data->celldatalen = 0;
    XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_find_value_start, data_sheet_expat_callback_find_cell_end);
  }
}